

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O1

undefined4 __thiscall
despot::RockSampleMMAPStateScenarioLowerBound::Value
          (RockSampleMMAPStateScenarioLowerBound *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  int iVar1;
  State *pSVar2;
  pointer pvVar3;
  pointer pCVar4;
  int iVar5;
  pointer ppSVar6;
  long lVar7;
  pointer piVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  double dVar15;
  vector<double,_std::allocator<double>_> expected_sampling_value;
  undefined8 local_80;
  RockSampleMMAPStateScenarioLowerBound *local_78;
  double local_70;
  double local_68;
  vector<double,_std::allocator<double>_> local_60;
  long local_48;
  undefined4 local_40 [4];
  
  std::vector<double,_std::allocator<double>_>::vector
            (&local_60,(long)this->rs_model_->num_rocks_,(allocator_type *)&local_80);
  despot::Coord::Coord((Coord *)&local_80,-1,-1);
  ppSVar6 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
      super__Vector_impl_data._M_finish == ppSVar6) {
    local_68 = 0.0;
    uVar10 = 0;
  }
  else {
    local_68 = 0.0;
    uVar14 = 0;
    local_78 = this;
    do {
      pSVar2 = ppSVar6[uVar14];
      iVar9 = this->rs_model_->num_rocks_;
      local_70 = (double)CONCAT44(local_70._4_4_,iVar9);
      iVar9 = *(int *)(pSVar2 + 0xc) >> ((byte)iVar9 & 0x1f);
      local_80 = Grid<int>::GetCoord(&this->rs_model_->grid_,iVar9);
      lVar7 = (long)this->rs_model_->num_rocks_;
      if (0 < lVar7) {
        uVar10 = *(uint *)(pSVar2 + 0xc);
        lVar12 = 0;
        do {
          local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar12] =
               *(double *)(pSVar2 + 0x18) *
               *(double *)(&DAT_00115060 + (ulong)((uVar10 >> ((uint)lVar12 & 0x1f) & 1) == 0) * 8)
               + local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar7 != lVar12);
      }
      local_68 = local_68 + *(double *)(pSVar2 + 0x18);
      uVar14 = uVar14 + 1;
      ppSVar6 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar14 < (ulong)((long)(particles->
                                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar6 >> 3
                             ));
    uVar10 = iVar9 << (SUB81(local_70,0) & 0x1f);
    this = local_78;
  }
  lVar7 = (long)this->rs_model_->num_rocks_;
  if (0 < lVar7) {
    lVar12 = 0;
    do {
      uVar13 = 1 << ((byte)lVar12 & 0x1f);
      if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar12] / local_68 <= 0.0) {
        uVar13 = 0;
      }
      uVar10 = uVar10 | uVar13;
      lVar12 = lVar12 + 1;
    } while (lVar7 != lVar12);
  }
  lVar7 = (long)(int)uVar10;
  pvVar3 = (this->rock_order_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_48 = lVar7 * 3;
  piVar8 = pvVar3[lVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&pvVar3[lVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data + 8) == piVar8) {
    local_70 = 1.0;
    local_78 = (RockSampleMMAPStateScenarioLowerBound *)0x0;
    iVar9 = -1;
  }
  else {
    iVar9 = -1;
    local_78 = (RockSampleMMAPStateScenarioLowerBound *)0x0;
    local_70 = 1.0;
    uVar14 = 0;
    do {
      lVar7 = (long)piVar8[uVar14];
      pCVar4 = (this->rs_model_->rock_pos_).
               super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar11 = *(int *)(pCVar4 + lVar7 * 8);
      iVar1 = *(int *)(pCVar4 + lVar7 * 8 + 4);
      if (iVar9 == -1) {
        iVar9 = 3;
        if (((int)local_80 <= iVar11) && (iVar9 = 1, iVar11 <= (int)local_80)) {
          iVar9 = 2;
          if (local_80._4_4_ <= iVar1) {
            iVar9 = (uint)(iVar1 <= local_80._4_4_) << 2;
          }
        }
      }
      iVar5 = despot::Coord::ManhattanDistance(CONCAT44(iVar1,iVar11),local_80);
      dVar15 = pow(_ParticleBelief,(double)iVar5);
      local_70 = local_70 * dVar15;
      local_78 = (RockSampleMMAPStateScenarioLowerBound *)
                 ((double)local_78 +
                 local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7] * local_70);
      local_80 = CONCAT44(iVar1,iVar11);
      uVar14 = uVar14 + 1;
      pvVar3 = (this->rock_order_).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar8 = *(pointer *)
                ((long)&(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data + local_48 * 8);
    } while (uVar14 < (ulong)(*(long *)((long)&(pvVar3->
                                               super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data + local_48 * 8 + 8) -
                              (long)piVar8 >> 2));
  }
  dVar15 = pow(_ParticleBelief,(double)(this->grid_->xsize_ - (int)local_80));
  iVar11 = 1;
  if (iVar9 != -1) {
    iVar11 = iVar9;
  }
  despot::ValuedAction::ValuedAction
            ((ValuedAction *)local_40,iVar11,dVar15 * local_68 * 10.0 * local_70 + (double)local_78)
  ;
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_40[0];
}

Assistant:

ValuedAction Value(const vector<State*>& particles, RandomStreams& streams,
		History& history) const {
		vector<double> expected_sampling_value = vector<double>(
			rs_model_->num_rocks_);
		int state = 0;
		Coord rob_pos(-1, -1);
		double total_weight = 0;
		for (int i = 0; i < particles.size(); i++) {
			State* particle = particles[i];
			state = (1 << rs_model_->num_rocks_)
				* rs_model_->GetRobPosIndex(particle);
			rob_pos = rs_model_->GetRobPos(particle);
			for (int r = 0; r < rs_model_->num_rocks_; r++) {
				expected_sampling_value[r] += particle->weight
					* (CheckFlag(particle->state_id, r) ? 10 : -10);
			}
			total_weight += particle->weight;
		}

		for (int rock = 0; rock < rs_model_->num_rocks_; rock++)
			if (expected_sampling_value[rock] / total_weight > 0.0)
				SetFlag(state, rock);

		ACT_TYPE action = -1;
		double value = 0;
		double discount = 1.0;
		for (int r = 0; r < rock_order_[state].size(); r++) {
			int rock = rock_order_[state][r];
			Coord rock_pos = rs_model_->rock_pos_[rock];

			if (action == -1) {
				if (rock_pos.x < rob_pos.x)
					action = Compass::WEST;
				else if (rock_pos.x > rob_pos.x)
					action = Compass::EAST;
				else if (rock_pos.y < rob_pos.y)
					action = Compass::SOUTH;
				else if (rock_pos.y > rob_pos.y)
					action = Compass::NORTH;
				else
					action = rs_model_->E_SAMPLE;
			}

			discount *= Globals::Discount(Coord::ManhattanDistance(rock_pos, rob_pos));
			value += discount * expected_sampling_value[rock];
			rob_pos = rock_pos;
		}

		if (action == -1)
			action = Compass::EAST;

		value += 10 * total_weight * discount
			* Globals::Discount(grid_.xsize() - rob_pos.x);

		return ValuedAction(action, value);
	}